

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_outputs_tests.cpp
# Opt level: O2

void __thiscall
wallet::group_outputs_tests::GroupVerifier::GroupVerify
          (GroupVerifier *this,OutputType type,CoinEligibilityFilter *filter,
          bool avoid_partial_spends,bool positive_only,int expected_size)

{
  long lVar1;
  CWallet *wallet;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  _Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> *filters;
  undefined4 in_register_0000008c;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string msg;
  initializer_list<wallet::SelectionFilter> __l;
  const_string file;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  allocator_type local_161;
  _Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> local_160;
  int expected_size_local;
  OutputType type_local;
  CoinSelectionParams local_140;
  SelectionFilter local_e8;
  _Rb_tree<wallet::CoinEligibilityFilter,_std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>,_std::_Select1st<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
  local_b8;
  OutputGroupTypeMap groups;
  
  pvVar4 = (iterator)CONCAT44(in_register_0000008c,expected_size);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  wallet = (this->wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_140.rng_fast = &this->rand;
  local_140.change_output_size = 0;
  local_140.change_spend_size = 0;
  local_140.m_min_change_target = 1000000;
  local_140.min_viable_change = 0;
  local_140.m_change_fee = 0;
  local_140.m_cost_of_change = 0;
  local_140.m_effective_feerate.nSatoshisPerK = 0;
  local_140.m_long_term_feerate.nSatoshisPerK = 0;
  local_140.m_discard_feerate.nSatoshisPerK._0_5_ = 0;
  local_140.m_discard_feerate.nSatoshisPerK._5_3_ = 0;
  local_140.tx_noinputs_size = 0;
  local_140.m_subtract_fee_outputs = false;
  local_140.m_include_unsafe_inputs = false;
  local_140.m_max_tx_weight.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_payload<int,_true,_true,_true>)0x0;
  local_e8.filter.conf_mine = filter->conf_mine;
  local_e8.filter.conf_theirs = filter->conf_theirs;
  local_e8.filter._17_8_ = *(undefined8 *)((long)&filter->max_descendants + 1);
  local_e8.filter.max_descendants._0_1_ =
       (undefined1)((ulong)*(undefined8 *)((long)&filter->max_ancestors + 1) >> 0x38);
  local_e8.filter.max_ancestors._0_1_ = (undefined1)filter->max_ancestors;
  local_e8.filter.max_ancestors._1_7_ = (undefined7)(filter->max_ancestors >> 8);
  local_e8.allow_mixed_output_types = true;
  __l._M_len = 1;
  __l._M_array = &local_e8;
  expected_size_local = expected_size;
  type_local = type;
  local_140.m_avoid_partial_spends = avoid_partial_spends;
  std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::vector
            ((vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> *)&local_160
             ,__l,&local_161);
  filters = &local_160;
  GroupOutputs((FilteredOutputGroups *)&local_b8,wallet,&this->coins_pool,&local_140,
               (vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> *)filters)
  ;
  pmVar2 = std::
           map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
           ::operator[]((map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
                         *)&local_b8,filter);
  OutputGroupTypeMap::OutputGroupTypeMap(&groups,pmVar2);
  std::
  _Rb_tree<wallet::CoinEligibilityFilter,_std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>,_std::_Select1st<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
  ::~_Rb_tree(&local_b8);
  std::_Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::
  ~_Vector_base(&local_160);
  if (positive_only) {
    pmVar3 = std::
             map<OutputType,_wallet::Groups,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
             ::operator[](&groups.groups_by_type,&type_local);
  }
  else {
    pmVar3 = std::
             map<OutputType,_wallet::Groups,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
             ::operator[](&groups.groups_by_type,&type_local);
    pmVar3 = (mapped_type *)&pmVar3->mixed_group;
  }
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/group_outputs_tests.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = pvVar4;
  msg.m_begin = (iterator)filters;
  file.m_end = (iterator)0x5d;
  file.m_begin = (iterator)&local_178;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_188,msg);
  local_140._8_8_ = local_140._8_8_ & 0xffffffffffffff00;
  local_140.rng_fast = (FastRandomContext *)&PTR__lazy_ostream_01139f30;
  local_140.m_min_change_target = (CAmount)boost::unit_test::lazy_ostream::inst;
  local_140.min_viable_change = 0xc694e1;
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/group_outputs_tests.cpp"
  ;
  local_190 = "";
  local_b8._M_impl._0_8_ =
       ((long)(pmVar3->positive_group).
              super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
              super__Vector_impl_data._M_finish -
       (long)(pmVar3->positive_group).
             super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
             super__Vector_impl_data._M_start) / 0x68;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&local_140,&local_198,0x5d,1,2,&local_b8,"groups_out.size()",&expected_size_local,
             "expected_size");
  OutputGroupTypeMap::~OutputGroupTypeMap(&groups);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void GroupVerify(const OutputType type,
                     const CoinEligibilityFilter& filter,
                     bool avoid_partial_spends,
                     bool positive_only,
                     int expected_size)
    {
        OutputGroupTypeMap groups = GroupOutputs(*wallet, coins_pool, makeSelectionParams(rand, avoid_partial_spends), {{filter}})[filter];
        std::vector<OutputGroup>& groups_out = positive_only ? groups.groups_by_type[type].positive_group :
                                               groups.groups_by_type[type].mixed_group;
        BOOST_CHECK_EQUAL(groups_out.size(), expected_size);
    }